

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_tailer.cpp
# Opt level: O3

char * __thiscall cornelich::excerpt_tailer::index(excerpt_tailer *this,char *__s,int __c)

{
  uint uVar1;
  vanilla_chronicle *pvVar2;
  int64_t iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  region *__tmp;
  undefined1 auVar9 [8];
  logic_error *this_00;
  int iVar10;
  ulong uVar11;
  int32_t file_number;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int32_t file_number_00;
  bool bVar15;
  string local_1d8 [32];
  undefined1 local_1b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  size_t local_1a8 [3];
  uint auStack_190 [88];
  
  pvVar2 = this->m_chronicle;
  auVar9 = (undefined1  [8])
           (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar12 = (pvVar2->m_entries_for_cycle_mask & (ulong)__s) >>
           ((byte)pvVar2->m_index_block_longs_bits & 0x3f);
  iVar3 = pvVar2->m_index_block_longs_mask;
  file_number_00 = (int32_t)((ulong)__s >> ((byte)pvVar2->m_entries_for_cycle_bits & 0x3f));
  iVar10 = (int)uVar12;
  bVar6 = this->m_last_index_file_number != iVar10;
  bVar7 = this->m_last_cycle != file_number_00;
  bVar15 = auVar9 == (undefined1  [8])0x0;
  if (bVar15 || (bVar6 || bVar7)) {
    vanilla_index::index_for
              ((vanilla_index *)local_1b8,(int)pvVar2 + 0xa0,file_number_00,SUB81(uVar12,0));
    p_Var8 = p_Stack_1b0;
    auVar9 = local_1b8;
    local_1b8 = (undefined1  [8])0x0;
    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)auVar9;
    p_Var4 = (this->m_index_region).
             super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var8;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
      }
      auVar9 = (undefined1  [8])
               (this->m_index_region).
               super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (auVar9 == (undefined1  [8])0x0) {
      return (char *)0x0;
    }
    this->m_last_cycle = file_number_00;
    this->m_last_index_file_number = iVar10;
  }
  uVar12 = *(ulong *)((long)((mapped_region *)
                            &(((vanilla_chronicle_settings *)auVar9)->m_cycle_format).
                             super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount)->m_base + (long)(int)(((uint)iVar3 & (uint)__s) << 3));
  if (uVar12 != 0) {
    pvVar2 = this->m_chronicle;
    bVar5 = -(char)(pvVar2->m_settings).m_thread_id_bits;
    uVar13 = ~(-1L << (bVar5 & 0x3f)) & uVar12;
    uVar11 = uVar13 >> ((byte)pvVar2->m_data_block_size_bits & 0x3f);
    uVar13 = uVar13 & pvVar2->m_data_block_size_mask;
    file_number = (int32_t)(uVar12 >> (bVar5 & 0x3f));
    iVar10 = (int)uVar11;
    if ((bVar15 || (bVar6 || bVar7)) ||
        (this->m_last_data_file_number != iVar10 || this->m_last_thread_id != file_number)) {
      p_Var4 = (this->m_data_region).
               super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
    }
    auVar9 = (undefined1  [8])
             (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (auVar9 == (undefined1  [8])0x0) {
      vanilla_data::data_for
                ((vanilla_data *)local_1b8,(int)this->m_chronicle + 0x110,file_number_00,file_number
                 ,SUB81(uVar11,0));
      p_Var8 = p_Stack_1b0;
      auVar9 = local_1b8;
      local_1b8 = (undefined1  [8])0x0;
      p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)auVar9;
      p_Var4 = (this->m_data_region).
               super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var8;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
        }
        auVar9 = (undefined1  [8])
                 (this->m_data_region).
                 super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      this->m_last_thread_id = file_number;
      this->m_last_data_file_number = iVar10;
      if (auVar9 == (undefined1  [8])0x0) {
        return (char *)0x0;
      }
    }
    if ((uVar13 & 3) != 0) {
      __assert_fail("(offset & 3) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich/region.h"
                    ,0x6d,"std::int32_t cornelich::region::read_ordered32(std::int32_t) const");
    }
    lVar14 = uVar13 << 0x20;
    uVar1 = *(uint *)((long)((mapped_region *)
                            &(((vanilla_chronicle_settings *)auVar9)->m_cycle_format).
                             super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount)->m_base + (lVar14 + -0x400000000 >> 0x20));
    if (uVar1 != 0) {
      if (uVar1 < 0xc0000000) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Corrupted length 0x",0x13);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] - 0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] - 0x18)) & 0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)local_1a8,uVar1);
        std::__cxx11::stringbuf::str();
        std::logic_error::logic_error(this_00,local_1d8);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      (this->m_buffer).m_data =
           (uint8_t *)
           ((lVar14 >> 0x20) +
           (long)(((this->m_data_region).
                   super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_region).m_base);
      (this->m_buffer).m_position = 0;
      (this->m_buffer).m_limit = ~uVar1;
      this->m_index = (int64_t)__s;
      return (char *)CONCAT71((int7)((ulong)__s >> 8),1);
    }
  }
  return (char *)0x0;
}

Assistant:

bool excerpt_tailer::index(std::int64_t index)
{
    auto cycle_for_index = static_cast<int32_t>(util::right_shift(index, m_chronicle.m_entries_for_cycle_bits));
    auto index_file_number = static_cast<int32_t>(util::right_shift(index & m_chronicle.m_entries_for_cycle_mask, m_chronicle.m_index_block_longs_bits));
    auto index_offset = index & m_chronicle.m_index_block_longs_mask;

    bool index_file_change = false;

    if(m_last_cycle != cycle_for_index || m_last_index_file_number != index_file_number || !m_index_region)
    {
        m_index_region = m_chronicle.m_index.index_for(cycle_for_index, index_file_number, false);
        if(!m_index_region)
            return false;
        index_file_change = true;
        m_last_cycle = cycle_for_index;
        m_last_index_file_number = index_file_number;
    }

    auto index_value = m_index_region->read_ordered64(static_cast<std::int32_t>(index_offset << 3));
    if(!index_value)
        return false;

    auto thread_id = static_cast<std::int32_t>(util::right_shift(index_value, m_chronicle.m_settings.index_data_offset_bits()));
    auto data_offset0 = index_value & m_chronicle.m_settings.index_data_offset_mask();
    auto data_file_number = static_cast<std::int32_t>(util::right_shift(data_offset0, m_chronicle.m_data_block_size_bits));
    auto data_offset = static_cast<std::int32_t>(data_offset0 & m_chronicle.m_data_block_size_mask);

    if(m_last_thread_id != thread_id || m_last_data_file_number != data_file_number || index_file_change)
        m_data_region.reset();

    if (!m_data_region)
    {
        m_data_region = m_chronicle.m_data.data_for(cycle_for_index, thread_id, data_file_number, false);
        m_last_thread_id = thread_id;
        m_last_data_file_number = data_file_number;
    }
    if (!m_data_region)
        return false;

    auto len = m_data_region->read_ordered32(data_offset - 4);
    if(len == 0)
        return false;

    auto len2 = ~len;
    // invalid if either the top two bits are set,
    if(util::right_shift(len2, 30))
        throw std::logic_error(util::streamer() << "Corrupted length 0x" << std::hex << len);

    m_buffer.reset(m_data_region->data() + data_offset, 0, len2);
    __builtin_prefetch(m_data_region->data() + 64, 0);
    m_index = index;

    return true;
}